

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

Aig_Obj_t * Saig_ManFindPivot(Aig_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  uVar3 = p->nRegs;
  if ((int)uVar3 < 1) {
    uVar3 = p->nObjs[6] + p->nObjs[5];
    if ((int)uVar3 < 2) {
      __assert_fail("Aig_ManNodeNum(p) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                    ,0x1bc,"Aig_Obj_t *Saig_ManFindPivot(Aig_Man_t *)");
    }
    lVar5 = (long)p->vObjs->nSize;
    if (0 < lVar5) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        pAVar2 = (Aig_Obj_t *)p->vObjs->pArray[lVar6];
        if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
          if (uVar7 == uVar3 >> 1) {
            return pAVar2;
          }
          uVar7 = uVar7 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
    pAVar2 = (Aig_Obj_t *)0x0;
  }
  else {
    pVVar1 = p->vCis;
    uVar7 = p->nTruePis;
    if (uVar3 == 1) {
      if (((int)uVar7 < 0) || (uVar4 = uVar7, pVVar1->nSize <= (int)uVar7)) {
LAB_00703425:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
LAB_007034d5:
      pAVar2 = (Aig_Obj_t *)pVVar1->pArray[uVar4];
    }
    else {
      uVar4 = uVar7 + (uVar3 >> 1);
      pAVar2 = (Aig_Obj_t *)0x0;
      uVar8 = 0;
      do {
        if (((int)uVar7 < 0) || (pVVar1->nSize <= (int)(uVar7 + uVar8))) goto LAB_00703425;
        if (uVar3 >> 1 == uVar8) goto LAB_007034d5;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Saig_ManFindPivot( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter;
    if ( Aig_ManRegNum(p) > 0 )
    {
        if ( Aig_ManRegNum(p) == 1 )
            return Saig_ManLo( p, 0 );
        Saig_ManForEachLo( p, pObj, i )
        {
            if ( i == Aig_ManRegNum(p)/2 )
                return pObj;
        }
    }
    else
    {
        Counter = 0;
        assert( Aig_ManNodeNum(p) > 1 );
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( Counter++ == Aig_ManNodeNum(p)/2 )
                return pObj;
        }
    }
    return NULL;
}